

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  bool bVar1;
  Address AVar2;
  Type TVar3;
  mapped_type *this_00;
  mapped_type *pmVar4;
  string name;
  Opcode local_5c;
  uint64_t local_58;
  string local_50;
  
  local_5c.enum_ = opc.enum_;
  local_58 = offset;
  AVar2 = Opcode::GetMemorySize(&local_5c);
  TVar3 = GetMemoryType(type,local_5c);
  AddrExpName_abi_cxx11_(&local_50,this,addr_exp);
  if (local_50._M_string_length != 0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::operator[](&this->vars,&local_50);
    pmVar4 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[](&this_00->accesses,&local_58);
    if ((pmVar4->byte_size != 0) &&
       (((pmVar4->byte_size != AVar2 || (pmVar4->type != TVar3)) || (pmVar4->align != align)))) {
      pmVar4->is_uniform = false;
    }
    bVar1 = Opcode::IsNaturallyAligned(&local_5c,align);
    if (!bVar1) {
      pmVar4->is_uniform = false;
    }
    pmVar4->byte_size = AVar2;
    pmVar4->type = TVar3;
    pmVar4->align = align;
    if ((this_00->same_type == TVar3 || (this_00->same_type).enum_ == Any) &&
       (this_00->same_align == align || this_00->same_align == 0xffffffffffffffff)) {
      this_00->same_type = TVar3;
      this_00->same_align = align;
      (this_00->last_opc).enum_ = local_5c.enum_;
    }
    else {
      (this_00->same_type).enum_ = Void;
      (this_00->same_type).type_index_ = 0;
      this_00->same_align = 0xffffffffffffffff;
    }
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void LoadStore(uint64_t offset,
                 Opcode opc,
                 Type type,
                 Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size && ((access.byte_size != byte_size) ||
                             (access.type != type) || (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }